

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall runtime::VirtualMachine::MakeObj(VirtualMachine *this)

{
  element_type *peVar1;
  pointer pOVar2;
  long lVar3;
  long lVar4;
  element_type *peVar5;
  size_t sVar6;
  VirtualMachine *this_00;
  ulong uVar7;
  long lVar8;
  Variable VVar9;
  undefined1 local_70 [32];
  VariableType local_50;
  anon_union_8_6_52c89740_for_Variable_1 local_48;
  anon_union_8_6_52c89740_for_Variable_1 local_40;
  VariableType local_34;
  
  sVar6 = getByteCodeParameter(this);
  peVar1 = (this->file).super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pOVar2 = (peVar1->objects).
           super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = this;
  if ((ulong)(((long)(peVar1->objects).
                     super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 3) *
             -0x5555555555555555) <= sVar6) {
LAB_00116f14:
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Index out of bounds in MakeObj","");
    panic(this_00,(string *)local_70);
  }
  local_40.objectValue = Heap::NewObject(&this->heap);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)local_40.objectValue);
  lVar8 = (long)*(pointer *)((long)(pOVar2 + sVar6) + 8) - *(long *)&pOVar2[sVar6].keys;
  if (lVar8 != 0) {
    uVar7 = lVar8 >> 5;
    this_00 = (VirtualMachine *)(local_70 + 0x10);
    lVar8 = lVar8 + -0x18;
    do {
      uVar7 = uVar7 - 1;
      lVar3 = *(long *)&pOVar2[sVar6].keys;
      if ((ulong)((long)*(pointer *)((long)&pOVar2[sVar6].keys + 8) - lVar3 >> 5) <= uVar7) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7
                  );
        goto LAB_00116f14;
      }
      VVar9 = popOpStack(this);
      local_34 = VVar9.type;
      lVar4 = *(long *)(lVar3 + -8 + lVar8);
      local_70._0_8_ = this_00;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,lVar4,*(long *)(lVar3 + lVar8) + lVar4);
      local_50 = local_34;
      local_48.integerValue = VVar9.field_1.integerValue;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,runtime::Variable>,std::allocator<std::pair<std::__cxx11::string_const,runtime::Variable>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string,runtime::Variable>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,runtime::Variable>,std::allocator<std::pair<std::__cxx11::string_const,runtime::Variable>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_40.integerValue,(string *)local_70);
      if ((VirtualMachine *)local_70._0_8_ != this_00) {
        operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
      }
      lVar8 = lVar8 + -0x20;
    } while (uVar7 != 0);
  }
  VVar9.field_1.integerValue = local_40.integerValue;
  VVar9._0_8_ = 5;
  pushOpStack(this,VVar9);
  peVar5 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar5->programCounter = peVar5->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::MakeObj() {

  std::size_t objIndex = this->getByteCodeParameter();

  if (objIndex >= this->file->objects.size()) {
    this->panic("Index out of bounds in MakeObj");
    return;
  }

  const auto& objProto = this->file->objects.at(objIndex);

  auto ret = this->heap.NewObject();
  ret->properties.clear();

  for (std::size_t i = objProto.keys.size(); i-- > 0;) {
    const std::string & key = objProto.keys.at(i);
    const Variable value = this->popOpStack();
    ret->properties.insert(std::make_pair(key, value));
  }

  this->pushObject(ret);
  this->advance();
}